

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::
error<unsigned_int&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,unsigned_char_const&,std::__cxx11::string&,int,unsigned_char&,int,int,int,int,int,int>
          (ValidationContext *this,IssueError *issue,uint *args,uchar *args_1,uchar *args_2,
          uchar *args_3,uchar *args_4,uchar *args_5,uchar *args_6,uchar *args_7,uchar *args_8,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,int *args_10,
          uchar *args_11,int *args_12,int *args_13,int *args_14,int *args_15,int *args_16,
          int *args_17)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  undefined1 *in_RSI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  ValidationReport *in_stack_00000010;
  ValidationReport *in_stack_00000018;
  int *in_stack_00000020;
  uchar *in_stack_00000028;
  int *in_stack_00000030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000038;
  uchar *in_stack_00000040;
  uchar *in_stack_00000048;
  uchar *in_stack_00000050;
  uchar *in_stack_00000058;
  uint *in_stack_00000060;
  undefined8 in_stack_00000070;
  basic_string_view<char> *in_stack_fffffffffffffae0;
  size_t in_stack_fffffffffffffae8;
  char *in_stack_fffffffffffffaf0;
  allocator<char> *in_stack_fffffffffffffb10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  undefined8 local_438;
  undefined8 local_430;
  allocator<char> local_411;
  undefined1 local_410;
  undefined2 local_40e;
  undefined1 auStack_3e8 [32];
  int *local_3c8;
  int *local_3c0;
  undefined1 *local_3a8;
  format_arg local_398 [7];
  format_args in_stack_fffffffffffffd48;
  string_view in_stack_fffffffffffffd58;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> local_158 [2];
  undefined8 local_138;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 *local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  format_arg *local_50;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_48;
  format_arg *local_40;
  undefined8 *local_38;
  
  *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
  local_3c8 = in_R9;
  local_3c0 = in_R8;
  local_3a8 = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)(in_RDI + 0x2c) = uVar1;
  local_410 = *local_3a8;
  local_40e = *(undefined2 *)(local_3a8 + 2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  local_80 = (undefined8 *)(local_3a8 + 0x18);
  local_78 = &local_438;
  local_90 = *local_80;
  local_88 = *(undefined8 *)(local_3a8 + 0x20);
  s._M_str = in_stack_fffffffffffffaf0;
  s._M_len = in_stack_fffffffffffffae8;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            (in_stack_fffffffffffffae0,s);
  local_38 = local_80;
  local_a8 = local_438;
  uStack_a0 = local_430;
  local_138 = in_stack_00000070;
  local_70 = &local_a8;
  local_98 = auStack_3e8;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,unsigned_char_const,unsigned_char_const,unsigned_char_const,unsigned_char_const,unsigned_char_const,unsigned_char_const,unsigned_char_const,unsigned_char_const,std::__cxx11::string,int,unsigned_char,int,int,int,int,int,int>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048,
             in_stack_00000040,in_stack_00000058,in_stack_00000050,in_stack_00000048,
             in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
             in_stack_00000020,(int *)in_stack_00000018,(int *)in_stack_00000010,in_stack_00000008,
             local_3c8,local_3c0);
  local_48 = local_158;
  local_50 = local_398;
  local_40 = local_50;
  ::fmt::v10::basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::
  basic_format_args(local_48,0x8000000000000012,local_50);
  ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffd58,in_stack_fffffffffffffd48);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)in_stack_00000018,in_stack_00000010);
  ValidationReport::~ValidationReport(in_stack_00000018);
  std::allocator<char>::~allocator(&local_411);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }